

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_endure(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  char *txt;
  long lVar5;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  iVar3 = get_skill(ch,(int)gsn_endure);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar5 = (long)gsn_endure;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x44e788 + (long)iVar3 * 2) <= sVar1) {
      bVar2 = is_affected(ch,(int)gsn_endure);
      if (bVar2) {
        txt = "You already have the mental resolve to resist magic.\n\r";
      }
      else {
        if (0x1d < ch->mana) {
          iVar3 = number_percent();
          iVar4 = get_skill(ch,(int)gsn_endure);
          if (iVar4 < iVar3) {
            send_to_char("You try to strengthen your mental resolve but fail.\n\r",ch);
            check_improve(ch,(int)gsn_endure,false,1);
            ch->mana = ch->mana + -0xf;
          }
          else {
            send_to_char("You build up the mental resolve to better resist magic.\n\r",ch);
            check_improve(ch,(int)gsn_endure,true,1);
            init_affect(&AStack_88);
            AStack_88.where = 0;
            AStack_88.type = gsn_endure;
            AStack_88.location = 0x19;
            AStack_88.modifier = -0x14;
            AStack_88.aftype = 1;
            AStack_88.level = ch->level;
            AStack_88.duration = AStack_88.level;
            affect_to_char(ch,&AStack_88);
            ch->mana = ch->mana + -0x1e;
          }
          return;
        }
        txt = "You don\'t have the mana.\n\r";
      }
      goto LAB_00297832;
    }
  }
  txt = "Huh?\n\r";
LAB_00297832:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_endure(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;

	if (get_skill(ch, gsn_endure) == 0 || ch->level < skill_table[gsn_endure].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_endure))
	{
		send_to_char("You already have the mental resolve to resist magic.\n\r", ch);
		return;
	}

	if (ch->mana < 30)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_endure))
	{
		send_to_char("You try to strengthen your mental resolve but fail.\n\r", ch);
		check_improve(ch, gsn_endure, false, 1);
		ch->mana -= 15;
		return;
	}

	send_to_char("You build up the mental resolve to better resist magic.\n\r", ch);
	check_improve(ch, gsn_endure, true, 1);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_endure;
	af.location = APPLY_SAVING_SPELL;
	af.aftype = AFT_SKILL;
	af.modifier = -20;
	af.level = ch->level;
	af.duration = ch->level;
	affect_to_char(ch, &af);

	ch->mana -= 30;
}